

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE
IoTHubClientCore_LL_AzureStorageCreateClient
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *azureBlobSasUri)

{
  LOGGER_LOG p_Var1;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE pIVar2;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0 || azureBlobSasUri == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_AzureStorageCreateClient",0xbbf,1,
                "invalid parameters iotHubClientHandle=%p, azureBlobSasUri=%p",iotHubClientHandle,
                azureBlobSasUri);
    }
    return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0;
  }
  pIVar2 = IoTHubClient_LL_UploadToBlob_CreateContext
                     (iotHubClientHandle->uploadToBlobHandle,azureBlobSasUri);
  return pIVar2;
}

Assistant:

IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE IoTHubClientCore_LL_AzureStorageCreateClient(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* azureBlobSasUri)
{
    IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE result;
    if (
        (iotHubClientHandle == NULL) ||
        (azureBlobSasUri == NULL)
        )
    {
        LogError("invalid parameters iotHubClientHandle=%p, azureBlobSasUri=%p", iotHubClientHandle, azureBlobSasUri);
        result = NULL;
    }
    else
    {
        result = IoTHubClient_LL_UploadToBlob_CreateContext(iotHubClientHandle->uploadToBlobHandle, azureBlobSasUri);
    }

    return result;
}